

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  iterator *piVar1;
  StackIter begin;
  StackIter begin_00;
  StackIter end;
  StackIter end_00;
  bool bVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  string *psVar5;
  PointerType pcVar6;
  char *pcVar7;
  iterator iVar8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  iterator local_198;
  iterator local_188;
  iterator local_178;
  iterator local_168;
  cmLinkedTree<cmDefinitions> *local_158;
  PositionType PStack_150;
  cmLinkedTree<cmDefinitions> *local_148;
  PositionType PStack_140;
  allocator<char> local_129;
  string local_128;
  string local_108 [8];
  string binDir;
  allocator<char> local_b1;
  string local_b0;
  string local_90 [8];
  string srcDir;
  PositionType local_68;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *local_60;
  PositionType local_58;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *local_50;
  PositionType local_48;
  undefined1 local_40 [8];
  iterator it;
  undefined1 local_20 [8];
  PositionType pos;
  cmState *this_local;
  
  pos.Position = (PositionType)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear(&(this->GlobalProperties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         );
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear(&this->PropertyDefinitions);
  cmGlobVerificationManager::Reset(this->GlobVerificationManager);
  _local_20 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  join_0x00000010_0x00000000_ =
       cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::Truncate(&this->ExecutionListFiles);
  _local_40 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                        (&this->BuildsystemDirectory);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->IncludeDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->IncludeDirectoryBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->CompileDefinitions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->CompileDefinitionsBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->CompileOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->CompileOptionsBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->LinkOptions);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->LinkOptionsBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->LinkDirectories);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
            (&pBVar3->LinkDirectoriesBacktraces);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  (pBVar3->DirectoryEnd).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_20;
  (pBVar3->DirectoryEnd).Position = (PositionType)pos.Tree;
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pBVar3->NormalTargetNames);
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear(&(pBVar3->Properties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         );
  pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     ((iterator *)local_40);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::clear(&pBVar3->Children);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::Clear(&this->PolicyStack);
  iVar8 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  local_50 = iVar8.Tree;
  (pSVar4->Policies).Tree = local_50;
  local_48 = iVar8.Position;
  (pSVar4->Policies).Position = local_48;
  iVar8 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  local_60 = iVar8.Tree;
  (pSVar4->PolicyRoot).Tree = local_60;
  local_58 = iVar8.Position;
  (pSVar4->PolicyRoot).Position = local_58;
  join_0x00000010_0x00000000_ =
       cmLinkedTree<cmStateDetail::PolicyStackEntry>::Root(&this->PolicyStack);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  (pSVar4->PolicyScope).Tree = (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)srcDir.field_2._8_8_
  ;
  (pSVar4->PolicyScope).Position = local_68;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->Policies);
  if (!bVar2) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,300,"cmStateSnapshot cmState::Reset()");
  }
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar4->PolicyRoot);
  if (!bVar2) {
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x12d,"cmStateSnapshot cmState::Reset()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_SOURCE_DIR",&local_b1);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  begin_00.Tree = (pSVar4->Vars).Tree;
  begin_00.Position = (pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  piVar1 = &pSVar4->Root;
  binDir.field_2._8_8_ = piVar1->Tree;
  end.Tree = piVar1->Tree;
  end.Position = piVar1->Position;
  psVar5 = cmDefinitions::Get(&local_b0,begin_00,end);
  std::__cxx11::string::string(local_90,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"CMAKE_BINARY_DIR",&local_129);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  local_148 = (pSVar4->Vars).Tree;
  PStack_140 = (pSVar4->Vars).Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  piVar1 = &pSVar4->Root;
  local_158 = piVar1->Tree;
  PStack_150 = (pSVar4->Root).Position;
  end_00.Tree = piVar1->Tree;
  end_00.Position = piVar1->Position;
  begin.Position = PStack_140;
  begin.Tree = local_148;
  psVar5 = cmDefinitions::Get(&local_128,begin,end_00);
  std::__cxx11::string::string(local_108,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  cmLinkedTree<cmDefinitions>::Clear(&this->VarTree);
  local_178 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  local_168 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,local_178);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pSVar4->Vars = local_168;
  local_188 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pSVar4->Parent = local_188;
  local_198 = cmLinkedTree<cmDefinitions>::Root(&this->VarTree);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pSVar4->Root = local_198;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"CMAKE_SOURCE_DIR",&local_1b9);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmDefinitions::Set(pcVar6,&local_1b8,pcVar7);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CMAKE_BINARY_DIR",&local_1e1);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmDefinitions::Set(pcVar6,&local_1e0,pcVar7);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"RULE_LAUNCH_COMPILE",&local_209);
  DefineProperty(this,&local_208,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"RULE_LAUNCH_LINK",&local_231);
  DefineProperty(this,&local_230,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"RULE_LAUNCH_CUSTOM",&local_259);
  DefineProperty(this,&local_258,DIRECTORY,"","",true);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"RULE_LAUNCH_COMPILE",&local_281);
  DefineProperty(this,&local_280,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"RULE_LAUNCH_LINK",&local_2a9);
  DefineProperty(this,&local_2a8,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"RULE_LAUNCH_CUSTOM",&local_2d1);
  DefineProperty(this,&local_2d0,TARGET,"","",true);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_20);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();
  this->GlobVerificationManager->Reset();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->IncludeDirectoryBacktraces.clear();
    it->CompileDefinitions.clear();
    it->CompileDefinitionsBacktraces.clear();
    it->CompileOptions.clear();
    it->CompileOptionsBacktraces.clear();
    it->LinkOptions.clear();
    it->LinkOptionsBacktraces.clear();
    it->LinkDirectories.clear();
    it->LinkDirectoriesBacktraces.clear();
    it->DirectoryEnd = pos;
    it->NormalTargetNames.clear();
    it->Properties.clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      *cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      *cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return cmStateSnapshot(this, pos);
}